

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::relaxedMaddF32x4
          (Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  Type *this_00;
  Literal *this_01;
  long lVar1;
  undefined1 local_1e8 [8];
  LaneArray<4> x;
  LaneArray<4> y;
  LaneArray<4> z;
  Literal local_b0;
  undefined1 auStack_98 [8];
  LaneArray<4> r;
  
  getLanesF32x4((LaneArray<4> *)local_1e8,this);
  getLanesF32x4((LaneArray<4> *)&x._M_elems[3].type,left);
  getLanesF32x4((LaneArray<4> *)&y._M_elems[3].type,right);
  r._M_elems[3].field_0.i64 = 0;
  r._M_elems[3].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[2].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[2].type.id = 0;
  r._M_elems[1].type.id = 0;
  r._M_elems[2].field_0.i64 = 0;
  r._M_elems[1].field_0.i64 = 0;
  r._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[0].type.id = 0;
  auStack_98 = (undefined1  [8])0x0;
  r._M_elems[0].field_0.i64 = 0;
  this_00 = &z._M_elems[3].type;
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x18) {
    madd(&local_b0,(Literal *)(local_1e8 + lVar1),(Literal *)((long)&x._M_elems[3].type.id + lVar1),
         (Literal *)((long)&y._M_elems[3].type.id + lVar1));
    Literal((Literal *)this_00,&local_b0);
    this_01 = (Literal *)((long)r._M_elems + lVar1 + -8);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    ~Literal(&local_b0);
  }
  Literal(__return_storage_ptr__,(LaneArray<4> *)auStack_98);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)auStack_98);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&y._M_elems[3].type);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&x._M_elems[3].type);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_1e8);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::relaxedMaddF32x4(const Literal& left,
                                  const Literal& right) const {
  return ternary<4, &Literal::getLanesF32x4, &Literal::madd>(
    *this, left, right);
}